

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O0

void amrex::anon_unknown_22::chop_boxes_dir(Box *bxv,Box *bx,int nboxes,int idir)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  int in_EDX;
  Box *in_RSI;
  undefined8 *in_RDI;
  int nright;
  int nleft;
  Box bxright;
  Box bxleft;
  int chop_pnt;
  uint idir_00;
  
  if (in_EDX == 1) {
    *in_RDI = *(undefined8 *)(in_RSI->smallend).vect;
    in_RDI[1] = *(undefined8 *)((in_RSI->smallend).vect + 2);
    in_RDI[2] = *(undefined8 *)((in_RSI->bigend).vect + 1);
    *(uint *)(in_RDI + 3) = (in_RSI->btype).itype;
  }
  else {
    iVar2 = Box::smallEnd(in_RSI,in_ECX);
    iVar3 = Box::length(in_RSI,in_ECX);
    iVar2 = iVar2 + iVar3 / 2;
    uVar1 = *(undefined8 *)((in_RSI->smallend).vect + 2);
    idir_00 = (in_RSI->btype).itype;
    Box::chop(*(Box **)((in_RSI->bigend).vect + 1),(int)((ulong)uVar1 >> 0x20),(int)uVar1);
    chop_boxes_dir(in_RSI,(Box *)CONCAT44(in_EDX,in_ECX),iVar2,idir_00);
    chop_boxes_dir(in_RSI,(Box *)CONCAT44(in_EDX,in_ECX),iVar2,idir_00);
  }
  return;
}

Assistant:

static void chop_boxes_dir (Box* bxv, const Box& bx, int nboxes, int idir)
{
    if (nboxes == 1)
    {
        *bxv = bx;
    }
    else
    {
        int chop_pnt = bx.smallEnd(idir) + bx.length(idir)/2;
        Box bxleft = bx;
        Box bxright = bxleft.chop(idir, chop_pnt);

        int nleft = nboxes / 2;
        chop_boxes_dir(bxv, bxleft, nleft, idir);

        int nright = nboxes - nleft;
        chop_boxes_dir(bxv+nleft, bxright, nright, idir);
    }
}